

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_sendReplyChunk
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  TadsServerThread *this_00;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  int iVar4;
  bodyArg *this_01;
  undefined8 *puVar5;
  long *plVar6;
  ssize_t sVar7;
  size_t __n;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  int in_R8D;
  long lVar8;
  http_reply_err err;
  char lbuf [20];
  err_frame_t err_cur__;
  
  if (oargc == (uint *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)(int)*oargc;
  }
  if ((getp_sendReplyChunk(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar4 = __cxa_guard_acquire(&getp_sendReplyChunk(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                  CONCAT44(in_register_00000034,self)), iVar4 != 0)) {
    getp_sendReplyChunk::desc.min_argc_ = 1;
    getp_sendReplyChunk::desc.opt_argc_ = 0;
    getp_sendReplyChunk::desc.varargs_ = 0;
    __cxa_guard_release(&getp_sendReplyChunk(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_sendReplyChunk::desc);
  if (iVar4 == 0) {
    lVar1 = *(long *)(this->super_CVmObject).ext_;
    this_00 = *(TadsServerThread **)(lVar1 + 0x38);
    if (*(int *)(lVar1 + 0x30) != 0) {
      throw_net_err("request already completed",0);
    }
    this_01 = (bodyArg *)operator_new(0x58);
    bodyArg::bodyArg(this_01,0);
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar5;
    plVar6 = (long *)_ZTW11G_err_frame();
    *plVar6 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      if (this_01->init_err != 0) {
        err_throw(this_01->init_err);
      }
      __n = (size_t)this_01->len;
      t3sprintf(lbuf,0x14,"%lx\r\n");
      sVar7 = TadsServerThread::send(this_00,(int)lbuf,__buf,__n,in_R8D);
      if ((int)sVar7 == 0) {
        throw_net_err("error sending length prefix",(this_00->socket->super_OS_CoreSocket).err);
      }
      sVar7 = bodyArg::send(this_01,(int)this_00,&err,__n,in_R8D);
      __buf_00 = extraout_RDX;
      if ((int)sVar7 == 0) {
        throw_net_err(err.msg,err.sock_err);
        __buf_00 = extraout_RDX_00;
      }
      sVar7 = TadsServerThread::send(this_00,0x2b4d59,__buf_00,__n,in_R8D);
      if ((int)sVar7 == 0) {
        throw_net_err("error sending suffix",(this_00->socket->super_OS_CoreSocket).err);
      }
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      bodyArg::~bodyArg(this_01);
      operator_delete(this_01,0x58);
    }
    peVar2 = err_cur__.prv_;
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    *puVar5 = peVar2;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar5 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pCVar3 = err_cur__.exc_;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar6 + 0x10) = pCVar3;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -lVar8;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_sendReplyChunk(VMG_ vm_obj_id_t self,
                                           vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request and thread */
    TadsHttpRequest *req = get_ext()->req;
    TadsServerThread *t = req->thread;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* retrieve the 'body' argument */
    bodyArg *body = new bodyArg(vmg_ 0);

    err_try
    {
        /* make sure we initialized the body correctly */
        if (body->init_err != 0)
            err_throw(body->init_err);
        
        /* send the length prefix */
        char lbuf[20];
        t3sprintf(lbuf, sizeof(lbuf), "%lx\r\n", (long)body->len);
        if (!t->send(lbuf))
            throw_net_err(vmg_ "error sending length prefix", t->last_error());

        /* send the body */
        http_reply_err err;
        if (!body->send(t, &err))
            throw_net_err(vmg_ err.msg, err.sock_err);

        /* send the CR-LF suffix */
        if (!t->send("\r\n"))
            throw_net_err(vmg_ "error sending suffix", t->last_error());
    }